

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  Encoding encoding;
  int iVar3;
  ostream *poVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string responseFileNameFull;
  cmGeneratedFileStream responseStream;
  string local_358;
  string local_338;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  pointer local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  undefined8 local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  undefined8 local_270;
  size_type local_268;
  pointer local_260;
  undefined8 local_258;
  
  encoding = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  if (encoding == UTF8_WITH_BOM) {
    iVar3 = std::__cxx11::string::compare((char *)language);
    if (iVar3 == 0) {
      bVar2 = true;
      bVar1 = false;
    }
    else {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"MSVC","");
      bVar2 = cmMakefile::IsOn(this_00,&local_358);
      bVar2 = !bVar2;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
    bVar2 = false;
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2)) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    encoding = UTF8;
  }
  local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318.second = &local_300;
  local_318.first._M_len = 0;
  local_318.first._M_str = &DAT_00000001;
  local_300._M_dataplus._M_p._0_1_ = 0x2f;
  local_280 = 1;
  local_270 = 0;
  local_260 = (name->_M_dataplus)._M_p;
  local_268 = name->_M_string_length;
  local_258 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_298;
  local_278 = local_318.second;
  cmCatViews(&local_338,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_338,false,encoding);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_298,(options->_M_dataplus)._M_p,options->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &local_338);
  local_318.first._M_str = (this->TargetBuildDirectory)._M_dataplus._M_p;
  local_318.first._M_len = (this->TargetBuildDirectory)._M_string_length;
  local_318.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_300._M_string_length = (size_type)local_2b8;
  local_2d0 = 0;
  local_2c8 = 1;
  local_2b8[0] = 0x2f;
  local_300._M_dataplus._M_p = (pointer)0x1;
  local_300.field_2._M_allocated_capacity = 0;
  local_2e0 = (name->_M_dataplus)._M_p;
  local_300.field_2._8_8_ = name->_M_string_length;
  local_2d8 = 0;
  views_00._M_len = 3;
  views_00._M_array = &local_318;
  local_2c0 = (undefined1 *)local_300._M_string_length;
  cmCatViews(__return_storage_ptr__,views_00);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends, std::string const& language)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt_Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling doesn't understand BOM encoded files.
  if (responseEncoding == codecvt_Encoding::UTF8_WITH_BOM &&
      (language == "CUDA" || !this->Makefile->IsOn("MSVC"))) {
    responseEncoding = codecvt_Encoding::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}